

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall
QPlainTextEditPrivate::append(QPlainTextEditPrivate *this,QString *text,TextFormat format)

{
  undefined1 uVar1;
  undefined1 uVar2;
  QObject *pQVar3;
  QPlainTextEditControl *pQVar4;
  QWidgetData *pQVar5;
  QScrollBar *this_00;
  bool bVar6;
  double dVar7;
  qreal qVar8;
  int iVar9;
  int iVar10;
  QTextDocument *pQVar11;
  long lVar12;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 *puStack_50;
  undefined4 *local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QObject **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  pQVar11 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
  QTextDocument::documentLayout();
  lVar12 = QMetaObject::cast((QObject *)&QPlainTextDocumentLayout::staticMetaObject);
  iVar9 = QTextDocument::maximumBlockCount();
  if (iVar9 != 0) {
    QTextDocument::setMaximumBlockCount((int)pQVar11);
  }
  if (*(short *)(*(long *)(pQVar3 + 0x20) + 8) < 0) {
    pQVar4 = this->control;
    QTextDocument::lastBlock();
    (**(code **)(*(long *)&pQVar4->super_QWidgetTextControl + 0x80))(&local_58,pQVar4,&local_68);
    dVar7 = (double)puStack_50 + local_40;
    qVar8 = verticalOffset(this,this->control->topBlock,this->topLine);
    pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    bVar6 = dVar7 - (qVar8 + this->topLineFracture) <=
            (double)((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i);
  }
  else {
    bVar6 = false;
  }
  if ((*(byte *)(*(long *)(pQVar3 + 0x20) + 9) & 0x80) == 0) {
    this->field_0x348 = this->field_0x348 | 2;
  }
  uVar1 = *(undefined1 *)(*(long *)(lVar12 + 8) + 0xb9);
  *(undefined1 *)(*(long *)(lVar12 + 8) + 0xb9) = 1;
  pQVar4 = this->control;
  if (format == PlainText) {
    QWidgetTextControl::appendPlainText((QWidgetTextControl *)pQVar4,text);
  }
  else if (format == RichText) {
    QWidgetTextControl::appendHtml((QWidgetTextControl *)pQVar4,text);
  }
  else {
    QWidgetTextControl::append((QWidgetTextControl *)pQVar4,text);
  }
  if (0 < iVar9) {
    iVar10 = QTextDocument::blockCount();
    if (iVar9 < iVar10) {
      iVar9 = this->control->topBlock;
      if (iVar9 != 0) {
        this->control->topBlock = iVar9 + -1;
        pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
        local_60 = CONCAT44((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i,
                            (pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i);
        puStack_50 = &local_68;
        local_68 = 0;
        local_48 = &local_6c;
        local_6c = 0;
        local_58 = (undefined1 *)0x0;
        QMetaObject::activate(pQVar3,&QPlainTextEdit::staticMetaObject,6,&local_58);
      }
      uVar2 = *(undefined1 *)(*(long *)(lVar12 + 8) + 0xb8);
      *(bool *)(*(long *)(lVar12 + 8) + 0xb8) = iVar9 != 0;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_58,pQVar11);
      QTextCursor::movePosition((MoveOperation)(QTextCursor *)&local_58,0x10,1);
      QTextCursor::removeSelectedText();
      *(undefined1 *)(*(long *)(lVar12 + 8) + 0xb8) = uVar2;
      QTextCursor::~QTextCursor((QTextCursor *)&local_58);
    }
    QTextDocument::setMaximumBlockCount((int)pQVar11);
  }
  *(undefined1 *)(*(long *)(lVar12 + 8) + 0xb9) = uVar1;
  adjustScrollbars(this);
  if (bVar6) {
    if ((this->field_0x348 & 8) != 0) {
      pQVar4 = this->control;
      QTextDocument::lastBlock();
      (**(code **)(*(long *)&pQVar4->super_QWidgetTextControl + 0x80))(&local_58,pQVar4,&local_68);
      dVar7 = (double)puStack_50 + local_40;
      qVar8 = verticalOffset(this,this->control->topBlock,this->topLine);
      pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      if (dVar7 - (qVar8 + this->topLineFracture) <=
          (double)((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i)) goto LAB_004a45a3;
    }
    this_00 = (this->super_QAbstractScrollAreaPrivate).vbar;
    iVar9 = QAbstractSlider::maximum(&this_00->super_QAbstractSlider);
    QAbstractSlider::setValue(&this_00->super_QAbstractSlider,iVar9);
  }
LAB_004a45a3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::append(const QString &text, Qt::TextFormat format)
{
    Q_Q(QPlainTextEdit);

    QTextDocument *document = control->document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(document->documentLayout());
    Q_ASSERT(documentLayout);

    int maximumBlockCount = document->maximumBlockCount();
    if (maximumBlockCount)
        document->setMaximumBlockCount(0);

    const bool atBottom =  q->isVisible()
                           && (control->blockBoundingRect(document->lastBlock()).bottom() - verticalOffset()
                               <= viewport->rect().bottom());

    if (!q->isVisible())
        showCursorOnInitialShow = true;

    bool documentSizeChangedBlocked = documentLayout->priv()->blockDocumentSizeChanged;
    documentLayout->priv()->blockDocumentSizeChanged = true;

    switch (format) {
    case Qt::RichText:
        control->appendHtml(text);
        break;
    case Qt::PlainText:
        control->appendPlainText(text);
        break;
    default:
        control->append(text);
        break;
    }

    if (maximumBlockCount > 0) {
        if (document->blockCount() > maximumBlockCount) {
            bool blockUpdate = false;
            if (control->topBlock) {
                control->topBlock--;
                blockUpdate = true;
                emit q->updateRequest(viewport->rect(), 0);
            }

            bool updatesBlocked = documentLayout->priv()->blockUpdate;
            documentLayout->priv()->blockUpdate = blockUpdate;
            QTextCursor cursor(document);
            cursor.movePosition(QTextCursor::NextBlock, QTextCursor::KeepAnchor);
            cursor.removeSelectedText();
            documentLayout->priv()->blockUpdate = updatesBlocked;
        }
        document->setMaximumBlockCount(maximumBlockCount);
    }

    documentLayout->priv()->blockDocumentSizeChanged = documentSizeChangedBlocked;
    adjustScrollbars();


    if (atBottom) {
        const bool needScroll =  !centerOnScroll
                                 || control->blockBoundingRect(document->lastBlock()).bottom() - verticalOffset()
                                 > viewport->rect().bottom();
        if (needScroll)
            vbar->setValue(vbar->maximum());
    }
}